

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_push_image(nk_draw_list *list,nk_handle texture)

{
  nk_draw_command *pnVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  nk_rect clip;
  
  if (list->cmd_count == 0) {
    uVar2 = 0xc6000000c6000000;
    uVar3 = 0x4680000046800000;
LAB_00121fc0:
    clip.w = (float)(int)uVar3;
    clip.h = (float)(int)((ulong)uVar3 >> 0x20);
    clip.x = (float)(int)uVar2;
    clip.y = (float)(int)((ulong)uVar2 >> 0x20);
    nk_draw_list_push_command(list,clip,texture);
    return;
  }
  pnVar1 = nk_draw_list_command_last(list);
  if (pnVar1->elem_count == 0) {
    pnVar1->texture = texture;
  }
  else if ((pnVar1->texture).id != texture.id) {
    uVar2._0_4_ = (pnVar1->clip_rect).x;
    uVar2._4_4_ = (pnVar1->clip_rect).y;
    uVar3._0_4_ = (pnVar1->clip_rect).w;
    uVar3._4_4_ = (pnVar1->clip_rect).h;
    goto LAB_00121fc0;
  }
  return;
}

Assistant:

NK_INTERN void
nk_draw_list_push_image(struct nk_draw_list *list, nk_handle texture)
{
    NK_ASSERT(list);
    if (!list) return;
    if (!list->cmd_count) {
        nk_draw_list_push_command(list, nk_null_rect, texture);
    } else {
        struct nk_draw_command *prev = nk_draw_list_command_last(list);
        if (prev->elem_count == 0) {
            prev->texture = texture;
        #ifdef NK_INCLUDE_COMMAND_USERDATA
            prev->userdata = list->userdata;
        #endif
    } else if (prev->texture.id != texture.id
        #ifdef NK_INCLUDE_COMMAND_USERDATA
            || prev->userdata.id != list->userdata.id
        #endif
        ) nk_draw_list_push_command(list, prev->clip_rect, texture);
    }
}